

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O2

void __thiscall CTPNDivAsi::gen_code(CTPNDivAsi *this,int discard,int param_2)

{
  CTcPrsNode *pCVar1;
  int iVar2;
  undefined4 in_register_00000034;
  void *ctx;
  
  pCVar1 = (this->super_CTPNBin).super_CTPNBinBase.left_;
  iVar2 = (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x12])
                    (pCVar1,CONCAT44(in_register_00000034,discard),1,4,"/=",
                     (this->super_CTPNBin).super_CTPNBinBase.right_,0,1,&ctx);
  if (iVar2 == 0) {
    CTPNBin::gen_binary_ca(&this->super_CTPNBin,'*');
    pCVar1 = (this->super_CTPNBin).super_CTPNBinBase.left_;
    (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x12])(pCVar1,discard,2,4,"/=",0,0,1,&ctx)
    ;
  }
  return;
}

Assistant:

void CTPNDivAsi::gen_code(int discard, int)
{
    /* 
     *   ask the left subnode to generate a divide-and-assign; if it
     *   can't, handle it generically 
     */
    void *ctx;
    if (!left_->gen_code_asi(discard, 1, TC_ASI_DIV, "/=",
                             right_, FALSE, TRUE, &ctx))
    {
        /* 
         *   there's no special coding for this assignment type -- compute
         *   the result generically, then assign the result as a simple
         *   assignment, which cannot be refused 
         */
        gen_binary_ca(OPC_DIV);
        left_->gen_code_asi(discard, 2, TC_ASI_DIV, "/=",
                            0, FALSE, TRUE, &ctx);
    }
}